

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c3dtypes.h
# Opt level: O2

void __thiscall EventInfo::~EventInfo(EventInfo *this)

{
  std::__cxx11::string::~string((string *)&this->context);
  std::__cxx11::string::~string((string *)this);
  return;
}

Assistant:

EventInfo() :
		label (""),
		context (""),
		time_minutes (0.f),
		time_seconds (0.f)
	{}